

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Bool prvTidyWarnMissingSIInEmittedDocType(TidyDocImpl *doc)

{
  uint uVar1;
  AttVal *pAVar2;
  long lVar3;
  long lVar4;
  Node *node;
  
  if (doc->lexer->isvoyager == no) {
    uVar1 = doc->lexer->versionEmitted;
    if (uVar1 != 1) {
      lVar3 = 0x2c;
      do {
        lVar4 = lVar3;
        if (lVar4 + 0x28 == 0x324) {
          return no;
        }
        lVar3 = lVar4 + 0x28;
      } while (*(uint *)((long)&W3C_Doctypes[0].score + lVar4) != uVar1);
      if (*(long *)((long)&W3C_Doctypes[0].xhtml + lVar4) == 0) {
        return no;
      }
    }
    lVar3 = 0x20;
    do {
      if (*(uint *)((long)CheckSvgAttr::values_6 + lVar3 + 4) == uVar1) {
        if (*(long *)((long)&W3C_Doctypes[0].score + lVar3) == 0) {
          return no;
        }
        if (doc == (TidyDocImpl *)0x0) {
          node = (Node *)0x0;
        }
        else {
          node = (doc->root).content;
        }
        for (; (node != (Node *)0x0 && (node->type != DocTypeTag)); node = node->next) {
        }
        if ((node != (Node *)0x0) &&
           (pAVar2 = prvTidyGetAttrByName(node,"SYSTEM"), pAVar2 == (AttVal *)0x0)) {
          return yes;
        }
        return no;
      }
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0x318);
  }
  return no;
}

Assistant:

Bool TY_(WarnMissingSIInEmittedDocType)( TidyDocImpl* doc )
{
    Bool isXhtml = doc->lexer->isvoyager;
    Node* doctype;
    
    /* Do not warn in XHTML mode */
    if ( isXhtml )
        return no;

    /* Do not warn if emitted doctype is proprietary */
    if ( TY_(HTMLVersionNameFromCode)(doc->lexer->versionEmitted, isXhtml ) == NULL )
        return no;

    /* Do not warn if no SI is possible */
    if ( GetSIFromVers(doc->lexer->versionEmitted) == NULL )
        return no;

    if ( (doctype = TY_(FindDocType)( doc )) != NULL
         && TY_(GetAttrByName)(doctype, "SYSTEM") == NULL )
        return yes;

    return no;
}